

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O3

MPI_Comm __thiscall henson::ProcMap::intercomm(ProcMap *this,string *to,int tag)

{
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_color _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  MPI_Comm poVar6;
  iterator iVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  long lVar10;
  MPI_Comm inter_comm;
  MPI_Comm intra_comm;
  MPI_Comm local_60;
  key_type local_58;
  MPI_Comm local_38;
  
  lVar10 = *(long *)(this + 8);
  do {
    if (lVar10 == *(long *)this) {
      lVar10 = *(long *)(this + 8);
      uVar4 = *(undefined8 *)(lVar10 + -0x98);
      uVar5 = *(undefined8 *)(lVar10 + -0x90);
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
                      *)(lVar10 + -0x88),to);
      MPI_Intercomm_create(uVar5,0,uVar4,cVar8._M_node[2]._M_color,tag,&local_60);
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
                      *)(*(long *)(this + 8) + -0x88),to);
      _Var2 = cVar8._M_node[2]._M_color;
      lVar10 = *(long *)(*(long *)(this + 8) + -0x50);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,lVar10,*(long *)(*(long *)(this + 8) + -0x48) + lVar10);
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
                      *)(*(long *)(this + 8) + -0x88),&local_58);
      _Var3 = cVar8._M_node[2]._M_color;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      MPI_Intercomm_merge(local_60,(int)_Var2 < (int)_Var3,&local_38);
      poVar6 = local_60;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                             *)(*(long *)(this + 8) + -0x30),to);
      pmVar9->inter_comm = poVar6;
      pmVar9->intra_comm = local_38;
      return local_60;
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                    *)(lVar10 + -0x30),to);
    p_Var1 = (_Base_ptr)(lVar10 + -0x28);
    lVar10 = lVar10 + -0x98;
  } while (iVar7._M_node == p_Var1);
  return *(MPI_Comm *)(iVar7._M_node + 2);
}

Assistant:

MPI_Comm    intercomm(const std::string& to, int tag = 0)
        {
            // It's necessary to cache intercomms: a puppet may call this
            // function multiple times (e.g., if it's restarted from scratch),
            // but subsequent calls to MPI_Intercomm_create cannot re-use the
            // same tag.

            // Search for the intercomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.inter_comm;
            }

            // If not found, create the intercomm at the lowest level
            MPI_Comm inter_comm;
            MPI_Intercomm_create(local(), 0, world(), leader(to), tag, &inter_comm);

            MPI_Comm intra_comm;
            int remote_leader = leader(to);
            int local_leader  = leader(group());
            MPI_Intercomm_merge(inter_comm, local_leader > remote_leader, &intra_comm);

            level().intercomm_cache[to] = { inter_comm, intra_comm };

            return inter_comm;
        }